

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Dvd::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Dvd *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  undefined8 uVar2;
  MthdSifmSrcSize *pMVar3;
  MthdSifmDvDy *pMVar4;
  MthdSifmDuDx *pMVar5;
  MthdSurfOffset *pMVar6;
  MthdDmaSurf *pMVar7;
  SingleMthdTest *pSVar8;
  result_type rVar9;
  Test *pTVar10;
  MthdDmaGrobj *pMVar11;
  MthdDvdSrcFormat *pMVar12;
  MthdSifmOffset *pMVar13;
  MthdSifmSrcPos *pMVar14;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *pvVar15;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_479;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *local_478
  ;
  MthdSifmSrcSize *local_470;
  MthdSifmDvDy *local_468;
  MthdSifmDuDx *local_460;
  MthdSifmSrcPos *local_458;
  MthdSifmOffset *local_450;
  MthdDvdSrcFormat *local_448;
  MthdSifmSrcSize *local_440;
  MthdSifmDvDy *local_438;
  MthdSifmDuDx *local_430;
  MthdSurfOffset *local_428;
  Test *local_420;
  Test *local_418;
  Test *local_410;
  MthdDmaSurf *local_408;
  MthdDmaGrobj *local_400;
  Test *local_3f8;
  Test *local_3f0;
  SingleMthdTest *local_3e8;
  Test *local_3e0;
  long local_3d8;
  undefined1 local_3d0 [40];
  undefined1 *local_3a8;
  long local_3a0;
  undefined1 local_398 [16];
  undefined1 *local_388;
  long local_380;
  undefined1 local_378 [16];
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  undefined1 *local_328;
  long local_320;
  undefined1 local_318 [16];
  undefined1 *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  SingleMthdTest *local_108;
  Test *local_100;
  undefined1 local_f8 [168];
  string local_50;
  
  local_3e8 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3e0 = (Test *)local_3d0;
  local_478 = (vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
               *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"nop","");
  pSVar8 = local_3e8;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_3e8,opt,(uint32_t)rVar9);
  (pSVar8->super_MthdTest).trapbit = -1;
  (pSVar8->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar8->s_cls = uVar1;
  pSVar8->s_mthd = 0x100;
  pSVar8->s_stride = 4;
  pSVar8->s_num = 1;
  pSVar8->s_trapbit = -1;
  (pSVar8->name)._M_dataplus._M_p = (pointer)&(pSVar8->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar8->name,local_3e0,(long)(local_3e0->rnd)._M_x + local_3d8 + -8);
  (pSVar8->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_108 = pSVar8;
  pTVar10 = (Test *)operator_new(0x25950);
  local_3d0._32_8_ = pTVar10;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar10,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_308,local_308 + local_300);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_100 = pTVar10;
  local_3f0 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"pm_trigger","");
  pTVar10 = local_3f0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3f0,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_328,local_328 + local_320);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_f8._0_8_ = pTVar10;
  local_3f8 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_348 = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"dma_notify","");
  pTVar10 = local_3f8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3f8,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 1;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_348,local_348 + local_340);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_f8._8_8_ = pTVar10;
  pMVar11 = (MthdDmaGrobj *)operator_new(0x25960);
  local_3d0._24_8_ = pMVar11;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"dma_ov","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar11,opt,(uint32_t)rVar9,&local_128,2,(this->super_Class).cls,0x184,1,0);
  local_f8._16_8_ = pMVar11;
  local_400 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"dma_src","");
  pMVar11 = local_400;
  MthdDmaGrobj::MthdDmaGrobj
            (local_400,opt,(uint32_t)rVar9,&local_148,3,(this->super_Class).cls,0x188,0,0);
  local_f8._24_8_ = pMVar11;
  local_408 = (MthdDmaSurf *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"dma_surf","");
  pMVar7 = local_408;
  uVar1 = (this->super_Class).cls;
  MthdDmaSurf::MthdDmaSurf
            (local_408,opt,(uint32_t)rVar9,&local_168,4,uVar1,0x18c,4,(uVar1 == 0x88) + 1);
  local_f8._32_8_ = pMVar7;
  local_410 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"xy","");
  pTVar10 = local_410;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_410,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 5;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_368,local_368 + local_360);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034f4f8;
  local_f8._40_8_ = pTVar10;
  local_418 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"rect","");
  pTVar10 = local_418;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_418,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 6;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_388,local_388 + local_380);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034f5f0;
  local_f8._48_8_ = pTVar10;
  local_420 = (Test *)operator_new(0x25950);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a8 = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"surf_format","");
  pTVar10 = local_420;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_420,opt,(uint32_t)rVar9);
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 7;
  pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_3a8,local_3a8 + local_3a0);
  pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350190;
  local_f8._56_8_ = pTVar10;
  local_428 = (MthdSurfOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"surf_offset","");
  pMVar6 = local_428;
  uVar1 = (this->super_Class).cls;
  MthdSurfOffset::MthdSurfOffset
            (local_428,opt,(uint32_t)rVar9,&local_188,8,uVar1,0x30c,4,(uVar1 == 0x88) + 1);
  local_f8._64_8_ = pMVar6;
  local_430 = (MthdSifmDuDx *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"src.dudx","");
  pMVar5 = local_430;
  anon_unknown_14::MthdSifmDuDx::MthdSifmDuDx
            (local_430,opt,(uint32_t)rVar9,&local_1a8,9,(this->super_Class).cls,0x310,0);
  local_f8._72_8_ = pMVar5;
  local_438 = (MthdSifmDvDy *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"src.dvdy","");
  pMVar4 = local_438;
  anon_unknown_14::MthdSifmDvDy::MthdSifmDvDy
            (local_438,opt,(uint32_t)rVar9,&local_1c8,10,(this->super_Class).cls,0x314,0);
  local_f8._80_8_ = pMVar4;
  local_440 = (MthdSifmSrcSize *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"src.size","");
  pMVar3 = local_440;
  anon_unknown_14::MthdSifmSrcSize::MthdSifmSrcSize
            (local_440,opt,(uint32_t)rVar9,&local_1e8,0xb,(this->super_Class).cls,0x318,0);
  local_f8._88_8_ = pMVar3;
  local_448 = (MthdDvdSrcFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"src.format","");
  pMVar12 = local_448;
  anon_unknown_14::MthdDvdSrcFormat::MthdDvdSrcFormat
            (local_448,opt,(uint32_t)rVar9,&local_208,0xc,(this->super_Class).cls,0x31c,0);
  local_f8._96_8_ = pMVar12;
  local_450 = (MthdSifmOffset *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"src.offset","");
  pMVar13 = local_450;
  anon_unknown_14::MthdSifmOffset::MthdSifmOffset
            (local_450,opt,(uint32_t)rVar9,&local_228,0xd,(this->super_Class).cls,800,0);
  local_f8._104_8_ = pMVar13;
  local_458 = (MthdSifmSrcPos *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"src.pos","");
  pMVar14 = local_458;
  anon_unknown_14::MthdSifmSrcPos::MthdSifmSrcPos
            (local_458,opt,(uint32_t)rVar9,&local_248,0xe,(this->super_Class).cls,0x324,0,false);
  local_f8._112_8_ = pMVar14;
  local_460 = (MthdSifmDuDx *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ov.dudx","");
  pMVar5 = local_460;
  anon_unknown_14::MthdSifmDuDx::MthdSifmDuDx
            (local_460,opt,(uint32_t)rVar9,&local_268,0xf,(this->super_Class).cls,0x328,1);
  local_f8._120_8_ = pMVar5;
  local_468 = (MthdSifmDvDy *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"ov.dvdy","");
  pMVar4 = local_468;
  anon_unknown_14::MthdSifmDvDy::MthdSifmDvDy
            (local_468,opt,(uint32_t)rVar9,&local_288,0x10,(this->super_Class).cls,0x32c,1);
  local_f8._128_8_ = pMVar4;
  local_470 = (MthdSifmSrcSize *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"ov.size","");
  pMVar3 = local_470;
  anon_unknown_14::MthdSifmSrcSize::MthdSifmSrcSize
            (local_470,opt,(uint32_t)rVar9,&local_2a8,0x11,(this->super_Class).cls,0x330,1);
  local_f8._136_8_ = pMVar3;
  pMVar12 = (MthdDvdSrcFormat *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ov.format","");
  anon_unknown_14::MthdDvdSrcFormat::MthdDvdSrcFormat
            (pMVar12,opt,(uint32_t)rVar9,&local_2c8,0x12,(this->super_Class).cls,0x334,1);
  local_f8._144_8_ = pMVar12;
  pMVar13 = (MthdSifmOffset *)operator_new(0x25958);
  local_3d0._16_8_ = pMVar13;
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"ov.offset","");
  anon_unknown_14::MthdSifmOffset::MthdSifmOffset
            (pMVar13,opt,(uint32_t)rVar9,&local_2e8,0x13,(this->super_Class).cls,0x338,1);
  local_f8._152_8_ = pMVar13;
  pMVar14 = (MthdSifmSrcPos *)operator_new(0x25958);
  rVar9 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_f8 + 0xa8),"ov.pos","");
  anon_unknown_14::MthdSifmSrcPos::MthdSifmSrcPos
            (pMVar14,opt,(uint32_t)rVar9,(string *)(local_f8 + 0xa8),0x14,(this->super_Class).cls,
             0x33c,1,true);
  pvVar15 = local_478;
  __l._M_len = 0x17;
  __l._M_array = &local_108;
  local_f8._160_8_ = pMVar14;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector((vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_478,__l,&local_479);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if (local_3e0 != (Test *)local_3d0) {
    operator_delete(local_3e0);
  }
  if ((char)(this->super_Class).cls == -0x78) {
    uVar2 = *(undefined8 *)pvVar15;
    pTVar10 = (Test *)operator_new(0x25950);
    rVar9 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_108 = (SingleMthdTest *)local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"sync","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar10,opt,(uint32_t)rVar9);
    *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
    *(uint32_t *)(pTVar10[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x894) = 0x108;
    *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar10[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar10[0x1e].rnd._M_x + 0x114) = 0xffffffff;
    pTVar10[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar10[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar10[0x1e].rnd._M_x + 0x115),local_108,
               (long)(local_108->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_100->rnd + -1) + 0x1378U);
    pTVar10->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348ac0;
    local_3e0 = pTVar10;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_478,uVar2,&local_3e0);
    pvVar15 = local_478;
    if (local_108 != (SingleMthdTest *)local_f8) {
      operator_delete(local_108);
      pvVar15 = local_478;
    }
  }
  return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)pvVar15;
}

Assistant:

std::vector<SingleMthdTest *> Dvd::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_ov", 2, cls, 0x184, 1, DMA_R),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 3, cls, 0x188, 0, DMA_R),
		new MthdDmaSurf(opt, rnd(), "dma_surf", 4, cls, 0x18c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmXy(opt, rnd(), "xy", 5, cls, 0x300),
		new MthdSifmRect(opt, rnd(), "rect", 6, cls, 0x304),
		new MthdSurfDvdFormat(opt, rnd(), "surf_format", 7, cls, 0x308),
		new MthdSurfOffset(opt, rnd(), "surf_offset", 8, cls, 0x30c, 4, cls == 0x88 ? SURF_NV10 : SURF_NV4),
		new MthdSifmDuDx(opt, rnd(), "src.dudx", 9, cls, 0x310, 0),
		new MthdSifmDvDy(opt, rnd(), "src.dvdy", 10, cls, 0x314, 0),
		new MthdSifmSrcSize(opt, rnd(), "src.size", 11, cls, 0x318, 0),
		new MthdDvdSrcFormat(opt, rnd(), "src.format", 12, cls, 0x31c, 0),
		new MthdSifmOffset(opt, rnd(), "src.offset", 13, cls, 0x320, 0),
		new MthdSifmSrcPos(opt, rnd(), "src.pos", 14, cls, 0x324, 0, false),
		new MthdSifmDuDx(opt, rnd(), "ov.dudx", 15, cls, 0x328, 1),
		new MthdSifmDvDy(opt, rnd(), "ov.dvdy", 16, cls, 0x32c, 1),
		new MthdSifmSrcSize(opt, rnd(), "ov.size", 17, cls, 0x330, 1),
		new MthdDvdSrcFormat(opt, rnd(), "ov.format", 18, cls, 0x334, 1),
		new MthdSifmOffset(opt, rnd(), "ov.offset", 19, cls, 0x338, 1),
		new MthdSifmSrcPos(opt, rnd(), "ov.pos", 20, cls, 0x33c, 1, true),
	};
	if ((cls & 0xff) == 0x88) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}